

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

int Mvc_CoverCountCubePairDiffs(Mvc_Cover_t *pCover,uchar *pDiffs)

{
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMVar1;
  long lVar2;
  uint uVar3;
  Mvc_CubeWord_t *pMVar4;
  long lVar5;
  Mvc_Cube_t *pMVar6;
  uchar uVar7;
  int iVar8;
  ulong uVar9;
  Mvc_CubeWord_t *pMVar10;
  bool bVar11;
  
  pCube = Mvc_CubeAlloc(pCover);
  pMVar1 = (pCover->lCubes).pHead;
  if (pMVar1 != (Mvc_Cube_t *)0x0) {
    lVar2 = (long)(int)(((int)((ulong)(long)pCover->nBits >> 3) + 1) -
                       (uint)((pCover->nBits & 7U) == 0));
    pMVar4 = pCube->pData;
    lVar5 = 0;
    do {
      pMVar6 = pMVar1->pNext;
      if (pMVar6 == (Mvc_Cube_t *)0x0) break;
      lVar5 = (long)(int)lVar5;
      do {
        uVar3 = *(uint *)&pMVar1->field_0x8 & 0xffffff;
        if (uVar3 == 0) {
          *pMVar4 = pMVar6->pData[0] ^ pMVar1->pData[0];
        }
        else if (uVar3 == 1) {
          pCube->pData[0] = pMVar6->pData[0] ^ pMVar1->pData[0];
          *(uint *)&pCube->field_0x14 = *(uint *)&pMVar6->field_0x14 ^ *(uint *)&pMVar1->field_0x14;
        }
        else {
          uVar9 = (ulong)(*(uint *)&pMVar1->field_0x8 & 0xffffff);
          do {
            pMVar4[uVar9] = pMVar6->pData[uVar9] ^ pMVar1->pData[uVar9];
            bVar11 = uVar9 != 0;
            uVar9 = uVar9 - 1;
          } while (bVar11);
        }
        iVar8 = 0;
        uVar7 = '\0';
        pMVar10 = pMVar4;
        if (0 < lVar2) {
          do {
            iVar8 = iVar8 + bit_count[(byte)*pMVar10];
            uVar7 = (uchar)iVar8;
            pMVar10 = (Mvc_CubeWord_t *)((long)pMVar10 + 1);
          } while (pMVar10 < (byte *)((long)pCube->pData + lVar2));
        }
        pDiffs[lVar5] = uVar7;
        lVar5 = lVar5 + 1;
        pMVar6 = pMVar6->pNext;
      } while (pMVar6 != (Mvc_Cube_t *)0x0);
      pMVar1 = pMVar1->pNext;
    } while (pMVar1 != (Mvc_Cube_t *)0x0);
  }
  Mvc_CubeFree(pCover,pCube);
  return 1;
}

Assistant:

int Mvc_CoverCountCubePairDiffs( Mvc_Cover_t * pCover, unsigned char pDiffs[] )
{
    Mvc_Cube_t * pCube1;
    Mvc_Cube_t * pCube2;
    Mvc_Cube_t * pMask;
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nBytes, nOnes;
    int nCubePairs;

    // allocate a temporary mask
    pMask = Mvc_CubeAlloc( pCover );
    // get the number of unsigned chars in the cube's bit strings
    nBytes = pCover->nBits / (8 * sizeof(unsigned char)) + (int)(pCover->nBits % (8 * sizeof(unsigned char)) > 0);
    // iterate through the cubes
    nCubePairs = 0;
    Mvc_CoverForEachCube( pCover, pCube1 )
    {
        Mvc_CoverForEachCubeStart( Mvc_CubeReadNext(pCube1), pCube2 )
        {
            // find the bit-wise exor of cubes
            Mvc_CubeBitExor( pMask, pCube1, pCube2 );
            // set the starting and stopping positions
            pByteStart = (unsigned char *)pMask->pData;
            pByteStop  = pByteStart + nBytes;
            // clean the counter of ones
            nOnes = 0;
            // iterate through the positions
            for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
                nOnes += bit_count[*pByte];
            // set the nOnes
            pDiffs[nCubePairs++] = nOnes;
        }
    }
    // deallocate the mask
    Mvc_CubeFree( pCover, pMask );
    return 1;
}